

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddConvexPolyFilled
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool anti_aliased)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  float fVar5;
  long lVar6;
  ImDrawIdx IVar7;
  undefined4 in_EAX;
  ulong uVar8;
  ImDrawIdx *pIVar9;
  int iVar10;
  ImDrawIdx IVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ImDrawIdx IVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImVec2 IVar23;
  ImVec2 IVar24;
  undefined4 uStack_38;
  uint local_34;
  
  IVar3 = GImGui->FontTexUvWhitePixel;
  if ((GImGui->Style).AntiAliasedShapes == false || !anti_aliased) {
    PrimReserve(this,points_count * 3 + -6,points_count);
    uVar8 = 0;
    uVar13 = 0;
    if (0 < points_count) {
      uVar13 = (ulong)(uint)points_count;
    }
    for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
      this->_VtxWritePtr->pos = points[uVar8];
      this->_VtxWritePtr->uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4->col = col;
      this->_VtxWritePtr = pIVar4 + 1;
    }
    uVar18 = this->_VtxCurrentIdx;
    pIVar9 = this->_IdxWritePtr;
    iVar10 = uVar18 + 2;
    for (iVar12 = 2; iVar12 < points_count; iVar12 = iVar12 + 1) {
      *pIVar9 = (ImDrawIdx)uVar18;
      pIVar9[1] = (ImDrawIdx)iVar10 - 1;
      pIVar9[2] = (ImDrawIdx)iVar10;
      pIVar9 = pIVar9 + 3;
      this->_IdxWritePtr = pIVar9;
      iVar10 = iVar10 + 1;
    }
    this->_VtxCurrentIdx = uVar18 + (points_count & 0xffffU);
  }
  else {
    _uStack_38 = CONCAT44(points_count * 2,in_EAX);
    PrimReserve(this,points_count * 9 + -6,points_count * 2);
    uVar18 = this->_VtxCurrentIdx;
    pIVar9 = this->_IdxWritePtr;
    iVar10 = uVar18 + 2;
    for (iVar12 = 2; IVar7 = (ImDrawIdx)uVar18, iVar12 < points_count; iVar12 = iVar12 + 1) {
      *pIVar9 = IVar7;
      pIVar9[1] = (ImDrawIdx)iVar10;
      iVar10 = iVar10 + 2;
      pIVar9[2] = (ImDrawIdx)iVar10;
      pIVar9 = pIVar9 + 3;
      this->_IdxWritePtr = pIVar9;
    }
    lVar6 = -0x38 - ((long)points_count * 8 + 0xfU & 0xfffffffffffffff0);
    uVar14 = points_count - 1;
    uVar13 = 0;
    uVar8 = (ulong)(uint)points_count;
    if (points_count < 1) {
      uVar8 = uVar13;
    }
    uVar15 = (ulong)uVar14;
    for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      lVar16 = (long)(int)uVar15;
      fVar20 = points[uVar13].x - points[lVar16].x;
      fVar21 = points[uVar13].y - points[lVar16].y;
      fVar22 = fVar20 * fVar20 + fVar21 * fVar21;
      uVar19 = -(uint)(0.0 < fVar22);
      fVar22 = (float)(~uVar19 & 0x3f800000 | (uint)(1.0 / SQRT(fVar22)) & uVar19);
      *(ulong *)((long)&uStack_38 + lVar16 * 8 + lVar6 + 0x38) =
           CONCAT44(fVar22 * -fVar20,fVar22 * fVar21);
      uVar15 = uVar13 & 0xffffffff;
    }
    for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      uVar1 = *(undefined8 *)((long)&uStack_38 + (long)(int)uVar14 * 8 + lVar6 + 0x38);
      uVar2 = *(undefined8 *)((long)&uStack_38 + uVar13 * 8 + lVar6 + 0x38);
      fVar22 = ((float)uVar2 + (float)uVar1) * 0.5;
      fVar20 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
      fVar21 = fVar22 * fVar22 + fVar20 * fVar20;
      if (1e-06 < fVar21) {
        fVar21 = 1.0 / fVar21;
        fVar5 = 100.0;
        if (fVar21 <= 100.0) {
          fVar5 = fVar21;
        }
        fVar22 = fVar22 * fVar5;
        fVar20 = fVar20 * fVar5;
      }
      IVar23.x = points[uVar13].x - fVar22 * 0.5;
      IVar23.y = points[uVar13].y - fVar20 * 0.5;
      this->_VtxWritePtr->pos = IVar23;
      this->_VtxWritePtr->uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4->col = col;
      IVar24.x = points[uVar13].x + fVar22 * 0.5;
      IVar24.y = points[uVar13].y + fVar20 * 0.5;
      pIVar4[1].pos = IVar24;
      this->_VtxWritePtr[1].uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4[1].col = col & 0xffffff;
      this->_VtxWritePtr = pIVar4 + 2;
      pIVar9 = this->_IdxWritePtr;
      IVar17 = (ImDrawIdx)uVar18;
      *pIVar9 = IVar17;
      pIVar9[1] = IVar7 + (short)uVar14 * 2;
      IVar11 = IVar7 + 1 + (short)uVar14 * 2;
      pIVar9[2] = IVar11;
      pIVar9[3] = IVar11;
      pIVar9[4] = IVar17 + 1;
      pIVar9[5] = IVar17;
      this->_IdxWritePtr = pIVar9 + 6;
      uVar14 = (uint)uVar13;
      uVar18 = uVar18 + 2;
    }
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + (local_34 & 0xfffe);
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col, bool anti_aliased)
{
    const ImVec2 uv = GImGui->FontTexUvWhitePixel;
    anti_aliased &= GImGui->Style.AntiAliasedShapes;
    //if (ImGui::GetIO().KeyCtrl) anti_aliased = false; // Debug

    if (anti_aliased)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & 0x00ffffff;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2));
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            ImVec2 diff = p1 - p0;
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i0].x = diff.y;
            temp_normals[i0].y = -diff.x;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            ImVec2 dm = (n0 + n1) * 0.5f;
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f)
            {
                float scale = 1.0f / dmr2;
                if (scale > 100.0f) scale = 100.0f;
                dm *= scale;
            }
            dm *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos = (points[i1] - dm); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos = (points[i1] + dm); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}